

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitCommon.c
# Opt level: O3

void sysbvm_jit_dwarfLineInfoEmissionState_addSourceCode
               (sysbvm_jit_dwarfLineInfoEmissionState_t *state,sysbvm_tuple_t sourceCode)

{
  int iVar1;
  long lVar2;
  sysbvm_sourceCode_t *sourceCodeObject;
  
  if ((sourceCode & 0xf) == 0 && sourceCode != 0) {
    if (0 < (long)state->fileCount) {
      lVar2 = 0;
      do {
        if (state->files[lVar2] == sourceCode) {
          return;
        }
        lVar2 = lVar2 + 1;
      } while (state->fileCount != lVar2);
    }
    sysbvm_jit_dwarfLineInfoEmissionState_addDirectory(state,*(sysbvm_tuple_t *)(sourceCode + 0x18))
    ;
    iVar1 = state->fileCount;
    state->fileCount = iVar1 + 1;
    state->files[iVar1] = sourceCode;
  }
  return;
}

Assistant:

void sysbvm_jit_dwarfLineInfoEmissionState_addSourceCode(sysbvm_jit_dwarfLineInfoEmissionState_t *state, sysbvm_tuple_t sourceCode)
{
    if(!sysbvm_tuple_isNonNullPointer(sourceCode))
        return;

    if(!sysbvm_jit_dwarfLineInfoEmissionState_indexOfFile(state, sourceCode))
    {
        sysbvm_sourceCode_t *sourceCodeObject = (sysbvm_sourceCode_t*)sourceCode;
        sysbvm_jit_dwarfLineInfoEmissionState_addDirectory(state, sourceCodeObject->directory);

        state->files[state->fileCount++] = sourceCode;
    }
}